

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

void merge_cache_lcp_2way<true,unsigned_char>
               (uchar **from0,lcp_t *lcp_input0,uchar *cache_input0,size_t n0,uchar **from1,
               lcp_t *lcp_input1,uchar *cache_input1,size_t n1,uchar **result,lcp_t *lcp_result,
               uchar *cache_result)

{
  uchar *puVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  byte c;
  byte c_00;
  int iVar4;
  ostream *poVar5;
  byte *pbVar6;
  byte *pbVar7;
  uchar **__dest;
  ptrdiff_t _Num;
  uchar **ppuVar8;
  lcp_t *local_d8;
  size_t local_d0;
  byte *local_c8;
  pointer local_c0;
  uchar **local_b8;
  pointer local_b0;
  byte *local_a0;
  lcp_t *local_98;
  lcp_t *local_90;
  size_t local_78;
  string local_70;
  string local_50;
  
  local_90 = lcp_result;
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"merge_cache_lcp_2way");
  poVar5 = std::operator<<(poVar5,"(): n0=");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,", n1=");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,'\n');
  check_input<unsigned_char>(from0,lcp_input0,cache_input0,n0);
  local_78 = n1;
  check_input<unsigned_char>(from1,lcp_input1,cache_input1,n1);
  local_c8 = cache_input0 + 1;
  c = *cache_input0;
  local_a0 = cache_input1 + 1;
  c_00 = *cache_input1;
  local_b8 = from1;
  local_98 = lcp_input1;
  if (c < c_00) {
    iVar4 = cmp(*from0,*from1);
    if (-1 < iVar4) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                   );
    }
    *result = *from0;
    *cache_result = c;
joined_r0x00219592:
    if (n0 == 1) {
      local_b0 = (pointer)0x0;
      __dest = result + 1;
      pbVar7 = cache_result + 1;
LAB_002195ab:
      if (local_78 == 0) {
        __assert_fail("n1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x51e,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                     );
      }
      *lcp_result = (lcp_t)local_b0;
      *pbVar7 = c_00;
      memmove(__dest,local_b8,local_78 * 8);
      memmove(lcp_result + 1,local_98,local_78 * 8);
LAB_0021965d:
      memmove(pbVar7 + 1,local_a0,local_78);
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,'~');
      poVar5 = std::operator<<(poVar5,"merge_cache_lcp_2way");
      std::operator<<(poVar5,'\n');
      return;
    }
    local_d0 = n0 - 1;
    local_b0 = (pointer)0x0;
    from0 = from0 + 1;
    local_c0 = (pointer)*lcp_input0;
    local_d8 = lcp_input0 + 1;
    c = cache_input0[1];
    local_c8 = cache_input0 + 2;
  }
  else {
    local_d8 = lcp_input0;
    local_d0 = n0;
    if (c_00 < c) {
      iVar4 = cmp(*from0,*from1);
      if (iVar4 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x45c,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                     );
      }
      *result = *from1;
      __dest = result + 1;
      *cache_result = c_00;
      pbVar7 = cache_result + 1;
      local_c0 = (pointer)0x0;
      local_78 = n1 - 1;
      if (local_78 == 0) {
        local_c0 = (pointer)0x0;
LAB_00219619:
        if (n0 == 0) {
          __assert_fail("n0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x527,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                       );
        }
        *lcp_result = (lcp_t)local_c0;
        *pbVar7 = c;
        memmove(__dest,from0,n0 * 8);
        memmove(lcp_result + 1,local_d8,n0 * 8);
        local_a0 = local_c8;
        local_78 = n0;
        goto LAB_0021965d;
      }
      local_b8 = from1 + 1;
      local_b0 = (pointer)*lcp_input1;
      local_98 = lcp_input1 + 1;
      c_00 = cache_input1[1];
      local_a0 = cache_input1 + 2;
    }
    else {
      if (c == 0) {
        iVar4 = cmp(*from0,*from1);
        if (iVar4 != 0) {
          __assert_fail("cmp(*from0, *from1) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x470,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                       );
        }
        *result = *from0;
        *cache_result = '\0';
        c_00 = 0;
        goto joined_r0x00219592;
      }
      compare((uchar *)&local_70,*from0,(size_t)*from1);
      local_c0 = local_70._M_dataplus._M_p;
      local_b0 = local_70._M_dataplus._M_p;
      if ((int)local_70._M_string_length < 0) {
        *result = *from0;
        __dest = result + 1;
        *cache_result = c;
        pbVar7 = cache_result + 1;
        local_c0 = (pointer)*lcp_input0;
        c = cache_input0[1];
        c_00 = get_char<unsigned_char>(*from1,(size_t)local_70._M_dataplus._M_p);
        local_d0 = n0 - 1;
        if (local_d0 == 0) goto LAB_002195ab;
        from0 = from0 + 1;
        local_d8 = lcp_input0 + 1;
        local_c8 = cache_input0 + 2;
      }
      else {
        __dest = result + 1;
        pbVar7 = cache_result + 1;
        if ((int)local_70._M_string_length == 0) {
          *result = *from0;
          *cache_result = c;
          c_00 = 0;
          local_d0 = n0 - 1;
          if (local_d0 == 0) goto LAB_002195ab;
          from0 = from0 + 1;
          local_c0 = (pointer)*lcp_input0;
          local_d8 = lcp_input0 + 1;
          c = cache_input0[1];
          local_c8 = cache_input0 + 2;
        }
        else {
          *result = *from1;
          *cache_result = c_00;
          local_b0 = (pointer)*lcp_input1;
          c = get_char<unsigned_char>(*from0,(size_t)local_70._M_dataplus._M_p);
          local_78 = n1 - 1;
          if (local_78 == 0) goto LAB_00219619;
          local_b8 = from1 + 1;
          local_98 = lcp_input1 + 1;
          c_00 = cache_input1[1];
          local_a0 = cache_input1 + 2;
        }
      }
    }
  }
  pbVar6 = cache_result + 1;
  ppuVar8 = result + 1;
LAB_00218d26:
  sVar2 = local_78;
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"Starting loop, n0=");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,", n1=");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," ...\n");
  poVar5 = std::operator<<(poVar5,"\tprev   = \'");
  poVar5 = std::operator<<(poVar5,(char *)ppuVar8[-1]);
  poVar5 = std::operator<<(poVar5,"\'\n");
  poVar5 = std::operator<<(poVar5,"\t*from0 = \'");
  poVar5 = std::operator<<(poVar5,(char *)*from0);
  poVar5 = std::operator<<(poVar5,"\'\n");
  poVar5 = std::operator<<(poVar5,"\t*from1 = \'");
  poVar5 = std::operator<<(poVar5,(char *)*local_b8);
  poVar5 = std::operator<<(poVar5,"\'\n");
  poVar5 = std::operator<<(poVar5,"\tlcp0   = ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"\tlcp1   = ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"\tcache0 = \'");
  to_str_abi_cxx11_(&local_70,c);
  poVar5 = std::operator<<(poVar5,(string *)&local_70);
  poVar5 = std::operator<<(poVar5,"\'\n");
  poVar5 = std::operator<<(poVar5,"\tcache1 = \'");
  to_str_abi_cxx11_(&local_50,c_00);
  poVar5 = std::operator<<(poVar5,(string *)&local_50);
  poVar5 = std::operator<<(poVar5,"\'\n");
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  check_lcp_and_cache<unsigned_char>
            (ppuVar8[-1],*from0,(lcp_t)local_c0,c,*local_b8,(lcp_t)local_b0,c_00);
  if (local_c0 <= local_b0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    n0 = local_d0;
    if (local_c0 < local_b0) {
      std::operator<<(poVar5,"\tlcp0 < lcp1\n");
      iVar4 = cmp(*from0,*local_b8);
      if (iVar4 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4b7,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                     );
      }
      *ppuVar8 = *local_b8;
      *local_90 = (lcp_t)local_b0;
      *pbVar6 = c_00;
      local_b0 = (pointer)*local_98;
      c_00 = *local_a0;
LAB_0021909d:
      local_78 = local_78 - 1;
      local_98 = local_98 + 1;
      local_a0 = local_a0 + 1;
      local_b8 = local_b8 + 1;
      lcp_result = local_90 + 1;
      __dest = ppuVar8 + 1;
      pbVar7 = pbVar6 + 1;
      pbVar6 = pbVar7;
      ppuVar8 = __dest;
      local_90 = lcp_result;
      if (sVar2 == 1) goto LAB_00219619;
      goto LAB_00218d26;
    }
    std::operator<<(poVar5,"\tlcp0 == lcp1\n");
    if (c < c_00) {
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
      std::operator<<(poVar5,"\t\tcache0 < cache1\n");
      iVar4 = cmp(*from0,*local_b8);
      if (-1 < iVar4) {
        __assert_fail("cmp(*from0, *from1) < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4c6,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                     );
      }
      *ppuVar8 = *from0;
      *local_90 = (lcp_t)local_c0;
      *pbVar6 = c;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
      if (c_00 < c) {
        std::operator<<(poVar5,"\t\tcache0 > cache1\n");
        iVar4 = cmp(*from0,*local_b8);
        if (iVar4 < 1) {
          __assert_fail("cmp(*from0, *from1) > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x4d6,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                       );
        }
        *ppuVar8 = *local_b8;
        *local_90 = (lcp_t)local_b0;
        *pbVar6 = c_00;
        local_b0 = (pointer)*local_98;
        c_00 = *local_a0;
        goto LAB_0021909d;
      }
      std::operator<<(poVar5,"\t\tcache0 == cache1\n");
      if (c != 0) {
        compare((uchar *)&local_70,*from0,(size_t)*local_b8);
        _Var3._M_p = local_70._M_dataplus._M_p;
        local_b0 = local_70._M_dataplus._M_p;
        if ((int)local_70._M_string_length < 0) {
          *ppuVar8 = *from0;
          *local_90 = (lcp_t)local_c0;
          *pbVar6 = c;
          local_c0 = (pointer)*local_d8;
          c = *local_c8;
          c_00 = get_char<unsigned_char>(*local_b8,(size_t)local_70._M_dataplus._M_p);
          goto LAB_00219170;
        }
        __dest = ppuVar8 + 1;
        lcp_result = local_90 + 1;
        pbVar7 = pbVar6 + 1;
        if ((int)local_70._M_string_length != 0) {
          puVar1 = *local_b8;
          local_b8 = local_b8 + 1;
          *ppuVar8 = puVar1;
          *local_90 = (lcp_t)local_c0;
          *pbVar6 = c;
          local_b0 = (pointer)*local_98;
          local_98 = local_98 + 1;
          c = get_char<unsigned_char>(*from0,(size_t)local_70._M_dataplus._M_p);
          c_00 = *local_a0;
          local_a0 = local_a0 + 1;
          local_78 = local_78 - 1;
          pbVar6 = pbVar7;
          local_c0 = _Var3._M_p;
          ppuVar8 = __dest;
          local_90 = lcp_result;
          if (local_78 == 0) goto LAB_00219619;
          goto LAB_00218d26;
        }
        *ppuVar8 = *from0;
        *local_90 = (lcp_t)local_c0;
        *pbVar6 = c;
        local_c0 = (pointer)*local_d8;
        c = *local_c8;
        c_00 = 0;
        goto LAB_00219170;
      }
      iVar4 = cmp(*from0,*local_b8);
      if (iVar4 != 0) {
        __assert_fail("cmp(*from0, *from1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4e7,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                     );
      }
      *ppuVar8 = *from0;
      *local_90 = (lcp_t)local_c0;
      *pbVar6 = 0;
    }
    local_c0 = (pointer)*local_d8;
    c = *local_c8;
    goto LAB_00219170;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar5,"\tlcp0 > lcp1\n");
  iVar4 = cmp(*from0,*local_b8);
  if (-1 < iVar4) {
    __assert_fail("cmp(*from0, *from1) < 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x4ae,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                 );
  }
  *ppuVar8 = *from0;
  *local_90 = (lcp_t)local_c0;
  *pbVar6 = c;
  local_c0 = (pointer)*local_d8;
  c = *local_c8;
LAB_00219170:
  local_c8 = local_c8 + 1;
  local_d8 = local_d8 + 1;
  __dest = ppuVar8 + 1;
  pbVar7 = pbVar6 + 1;
  from0 = from0 + 1;
  lcp_result = local_90 + 1;
  local_d0 = local_d0 - 1;
  pbVar6 = pbVar7;
  ppuVar8 = __dest;
  local_90 = lcp_result;
  if (local_d0 == 0) goto LAB_002195ab;
  goto LAB_00218d26;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}